

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O0

XMLURL * __thiscall xercesc_4_0::XMLURL::operator=(XMLURL *this,XMLURL *toAssign)

{
  XMLCh *pXVar1;
  XMLURL *toAssign_local;
  XMLURL *this_local;
  
  if (this != toAssign) {
    cleanUp(this);
    this->fMemoryManager = toAssign->fMemoryManager;
    pXVar1 = XMLString::replicate(toAssign->fFragment,this->fMemoryManager);
    this->fFragment = pXVar1;
    pXVar1 = XMLString::replicate(toAssign->fHost,this->fMemoryManager);
    this->fHost = pXVar1;
    pXVar1 = XMLString::replicate(toAssign->fPassword,this->fMemoryManager);
    this->fPassword = pXVar1;
    pXVar1 = XMLString::replicate(toAssign->fPath,this->fMemoryManager);
    this->fPath = pXVar1;
    this->fPortNum = toAssign->fPortNum;
    this->fProtocol = toAssign->fProtocol;
    pXVar1 = XMLString::replicate(toAssign->fQuery,this->fMemoryManager);
    this->fQuery = pXVar1;
    pXVar1 = XMLString::replicate(toAssign->fUser,this->fMemoryManager);
    this->fUser = pXVar1;
    pXVar1 = XMLString::replicate(toAssign->fURLText,this->fMemoryManager);
    this->fURLText = pXVar1;
    this->fHasInvalidChar = (bool)(toAssign->fHasInvalidChar & 1);
  }
  return this;
}

Assistant:

XMLURL& XMLURL::operator=(const XMLURL& toAssign)
{
    if (this == &toAssign)
        return *this;

    // Clean up our stuff
    cleanUp();

    // And copy his stuff
    fMemoryManager = toAssign.fMemoryManager;
    fFragment = XMLString::replicate(toAssign.fFragment, fMemoryManager);
    fHost = XMLString::replicate(toAssign.fHost, fMemoryManager);
    fPassword = XMLString::replicate(toAssign.fPassword, fMemoryManager);
    fPath = XMLString::replicate(toAssign.fPath, fMemoryManager);
    fPortNum = toAssign.fPortNum;
    fProtocol = toAssign.fProtocol;
    fQuery = XMLString::replicate(toAssign.fQuery, fMemoryManager);
    fUser = XMLString::replicate(toAssign.fUser, fMemoryManager);
    fURLText = XMLString::replicate(toAssign.fURLText, fMemoryManager);
    fHasInvalidChar = toAssign.fHasInvalidChar;

    return *this;
}